

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_xi(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *s_00;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 val;
  _Bool _Var3;
  uint uVar4;
  TCGTemp *pTVar5;
  
  s_00 = s->uc->tcg_ctx;
  pTVar5 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
  o->in1 = (TCGv_i64)((long)pTVar5 - (long)s_00);
  _Var3 = s390_has_feat(s->uc,S390_FEAT_INTERLOCKED_ACCESS_2);
  pTVar1 = o->in1;
  pTVar2 = o->addr1;
  if (_Var3) {
    val = o->in2;
    uVar4 = get_mem_index(s);
    tcg_gen_atomic_fetch_xor_i64_s390x
              (s_00,pTVar1,pTVar2,val,(ulong)uVar4,(MemOp_conflict)s->insn->data);
  }
  else {
    uVar4 = get_mem_index(s);
    tcg_gen_qemu_ld_i64_s390x(s_00,pTVar1,pTVar2,(ulong)uVar4,(MemOp_conflict)s->insn->data);
  }
  tcg_gen_op3_s390x(s_00,INDEX_op_xor_i64,(TCGArg)(o->out + (long)s_00),
                    (TCGArg)(o->in1 + (long)s_00),(TCGArg)(o->in2 + (long)s_00));
  _Var3 = s390_has_feat(s->uc,S390_FEAT_INTERLOCKED_ACCESS_2);
  if (!_Var3) {
    pTVar1 = o->out;
    pTVar2 = o->addr1;
    uVar4 = get_mem_index(s);
    tcg_gen_qemu_st_i64_s390x(s_00,pTVar1,pTVar2,(ulong)uVar4,(MemOp_conflict)s->insn->data);
  }
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_xi(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in1 = tcg_temp_new_i64(tcg_ctx);

    if (!s390_has_feat(s->uc, S390_FEAT_INTERLOCKED_ACCESS_2)) {
        tcg_gen_qemu_ld_tl(tcg_ctx, o->in1, o->addr1, get_mem_index(s), s->insn->data);
    } else {
        /* Perform the atomic operation in memory. */
        tcg_gen_atomic_fetch_xor_i64(tcg_ctx, o->in1, o->addr1, o->in2, get_mem_index(s),
                                     s->insn->data);
    }

    /* Recompute also for atomic case: needed for setting CC. */
    tcg_gen_xor_i64(tcg_ctx, o->out, o->in1, o->in2);

    if (!s390_has_feat(s->uc, S390_FEAT_INTERLOCKED_ACCESS_2)) {
        tcg_gen_qemu_st_tl(tcg_ctx, o->out, o->addr1, get_mem_index(s), s->insn->data);
    }
    return DISAS_NEXT;
}